

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllOnes(IEEEFloat *this)

{
  Significand *pSVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  Significand *pSVar6;
  
  uVar2 = this->semantics->precision;
  if (uVar2 - 0x40 < 0xffffff80) {
    pSVar6 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar6 = &this->significand;
  }
  uVar4 = (ulong)((uVar2 + 0x40 >> 6) - 1);
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      iVar3 = (uVar2 + 0x40 & 0xffffffc0) - uVar2;
      if (iVar3 + 1U < 0x41) {
        return (-1L << (~(byte)iVar3 & 0x3f) | pSVar6[uVar4].part) == 0xffffffffffffffff;
      }
      __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"fill than integerPartWidth\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x314,"bool llvm::detail::IEEEFloat::isSignificandAllOnes() const");
    }
    pSVar1 = pSVar6 + uVar5;
    uVar5 = uVar5 + 1;
  } while (pSVar1->part == 0xffffffffffffffff);
  return false;
}

Assistant:

bool IEEEFloat::isSignificandAllOnes() const {
  // Test if the significand excluding the integral bit is all ones. This allows
  // us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();
  for (unsigned i = 0; i < PartCount - 1; i++)
    if (~Parts[i])
      return false;

  // Set the unused high bits to all ones when we compare.
  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "fill than integerPartWidth");
  const integerPart HighBitFill =
    ~integerPart(0) << (integerPartWidth - NumHighBits);
  if (~(Parts[PartCount - 1] | HighBitFill))
    return false;

  return true;
}